

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToZip
          (GeneratorContextImpl *this,string *filename)

{
  pointer *this_00;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  ostream *poVar4;
  reference filename_00;
  bool bVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  undefined1 local_90 [8];
  ZipWriter zip_writer;
  FileOutputStream stream;
  int error;
  int file_descriptor;
  string *filename_local;
  GeneratorContextImpl *this_local;
  
  if ((this->had_error_ & 1U) == 0) {
    do {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = open(pcVar2,0x241,0x1b6);
      bVar5 = false;
      if (iVar1 < 0) {
        piVar3 = __errno_location();
        bVar5 = *piVar3 == 4;
      }
    } while (bVar5);
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)filename);
      poVar4 = std::operator<<(poVar4,": ");
      pcVar2 = strerror(iVar1);
      std::operator<<(poVar4,pcVar2);
      this_local._7_1_ = false;
    }
    else {
      this_00 = &zip_writer.files_.
                 super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      io::FileOutputStream::FileOutputStream((FileOutputStream *)this_00,iVar1,-1);
      ZipWriter::ZipWriter((ZipWriter *)local_90,(ZeroCopyOutputStream *)this_00);
      __end2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(&this->files_);
      pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(&this->files_);
      while (bVar5 = std::operator!=(&__end2,(_Self *)&pair), bVar5) {
        filename_00 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator*(&__end2);
        ZipWriter::Write((ZipWriter *)local_90,&filename_00->first,&filename_00->second);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end2);
      }
      ZipWriter::WriteDirectory((ZipWriter *)local_90);
      iVar1 = io::FileOutputStream::GetErrno
                        ((FileOutputStream *)
                         &zip_writer.files_.
                          super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (iVar1 == 0) {
        bVar5 = io::FileOutputStream::Close
                          ((FileOutputStream *)
                           &zip_writer.files_.
                            super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar5) {
          this_local._7_1_ = true;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)filename);
          poVar4 = std::operator<<(poVar4,": ");
          iVar1 = io::FileOutputStream::GetErrno
                            ((FileOutputStream *)
                             &zip_writer.files_.
                              super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pcVar2 = strerror(iVar1);
          poVar4 = std::operator<<(poVar4,pcVar2);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = false;
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)filename);
        poVar4 = std::operator<<(poVar4,": ");
        iVar1 = io::FileOutputStream::GetErrno
                          ((FileOutputStream *)
                           &zip_writer.files_.
                            super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar2 = strerror(iVar1);
        poVar4 = std::operator<<(poVar4,pcVar2);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
      ZipWriter::~ZipWriter((ZipWriter *)local_90);
      io::FileOutputStream::~FileOutputStream
                ((FileOutputStream *)
                 &zip_writer.files_.
                  super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToZip(
    const std::string& filename) {
  if (had_error_) {
    return false;
  }

  // Create the output file.
  int file_descriptor;
  do {
    file_descriptor =
        open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (file_descriptor < 0 && errno == EINTR);

  if (file_descriptor < 0) {
    int error = errno;
    std::cerr << filename << ": " << strerror(error);
    return false;
  }

  // Create the ZipWriter
  io::FileOutputStream stream(file_descriptor);
  ZipWriter zip_writer(&stream);

  for (const auto& pair : files_) {
    zip_writer.Write(pair.first, pair.second);
  }

  zip_writer.WriteDirectory();

  if (stream.GetErrno() != 0) {
    std::cerr << filename << ": " << strerror(stream.GetErrno()) << std::endl;
    return false;
  }

  if (!stream.Close()) {
    std::cerr << filename << ": " << strerror(stream.GetErrno()) << std::endl;
    return false;
  }

  return true;
}